

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_client.c
# Opt level: O2

int proxy_client_send(proxy_client_handle *ch,proxy_msg *msg,uint8_t *buff)

{
  conn_handle *conn;
  int iVar1;
  
  conn = (conn_handle *)ch->priv;
  iVar1 = conn_send(conn,&msg->type,9);
  if ((-1 < iVar1) && ((ulong)msg->size != 0)) {
    iVar1 = conn_send(conn,buff,(ulong)msg->size);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int proxy_client_send(struct proxy_client_handle *ch,
		      const struct proxy_msg *msg, const uint8_t *buff)
{
	struct proxy_client_priv *priv = ch->priv;
	int ret;

	ret = conn_send(&priv->conn, (uint8_t *)msg, sizeof(*msg));
	if (ret >= 0 && msg->size > 0)
		ret = conn_send(&priv->conn, buff, msg->size);

	return ret;
}